

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.c
# Opt level: O2

void lws_header_table_reset(lws *wsi,int autoservice)

{
  short *psVar1;
  pollfd *pollfd;
  allocated_headers *ah;
  uint __line;
  size_t sVar2;
  char *__assertion;
  
  ah = (wsi->http).ah;
  if (ah == (allocated_headers *)0x0) {
    __assertion = "ah";
    __line = 0x74;
  }
  else {
    if (ah->wsi == wsi) {
      _lws_header_table_reset(ah);
      wsi->field_0x2dc = wsi->field_0x2dc & 0xfe;
      __lws_set_timeout(wsi,PENDING_TIMEOUT_HOLDING_AH,wsi->vhost->timeout_secs_ah_idle);
      time(&ah->assigned);
      if (wsi->position_in_fds_table != -1) {
        sVar2 = lws_buflist_next_segment_len(&wsi->buflist,(uint8_t **)0x0);
        if ((autoservice != 0) && (sVar2 != 0)) {
          _lws_log(0x10,"%s: service on readbuf ah\n","__lws_header_table_reset");
          pollfd = wsi->context->pt[wsi->tsi].fds + wsi->position_in_fds_table;
          psVar1 = &pollfd->revents;
          *psVar1 = *psVar1 | 1;
          _lws_log(1,"%s: calling service\n","__lws_header_table_reset");
          lws_service_fd_tsi(wsi->context,pollfd,(int)wsi->tsi);
          return;
        }
      }
      return;
    }
    __assertion = "ah->wsi == wsi";
    __line = 0x76;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/dmikushin[P]libwebsockets/lib/roles/http/parsers.c"
                ,__line,"void __lws_header_table_reset(struct lws *, int)");
}

Assistant:

void
_lws_header_table_reset(struct allocated_headers *ah)
{
	/* init the ah to reflect no headers or data have appeared yet */
	memset(ah->frag_index, 0, sizeof(ah->frag_index));
	memset(ah->frags, 0, sizeof(ah->frags));
	ah->nfrag = 0;
	ah->pos = 0;
	ah->http_response = 0;
	ah->parser_state = WSI_TOKEN_NAME_PART;
	ah->lextable_pos = 0;
#if defined(LWS_WITH_CUSTOM_HEADERS)
	ah->unk_pos = 0;
	ah->unk_ll_head = 0;
	ah->unk_ll_tail = 0;
#endif
}